

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerbase.cpp
# Opt level: O2

UINT8 PlayerBase::InitDeviceOptions(PLR_DEV_OPTS *devOpts)

{
  devOpts->srMode = '\0';
  devOpts->resmplMode = '\0';
  devOpts->emuCore[0] = 0;
  devOpts->emuCore[1] = 0;
  devOpts->smplRate = 0;
  devOpts->coreOpts = 0;
  (devOpts->muteOpts).disable = '\0';
  memset((devOpts->muteOpts).chnMute,0,0x88);
  return '\0';
}

Assistant:

UINT8 PlayerBase::InitDeviceOptions(PLR_DEV_OPTS& devOpts)
{
	devOpts.emuCore[0] = 0x00;
	devOpts.emuCore[1] = 0x00;
	devOpts.srMode = DEVRI_SRMODE_NATIVE;
	devOpts.resmplMode = 0x00;
	devOpts.smplRate = 0;
	devOpts.coreOpts = 0x00;
	devOpts.muteOpts.disable = 0x00;
	devOpts.muteOpts.chnMute[0] = 0x00;
	devOpts.muteOpts.chnMute[1] = 0x00;
	memset(devOpts.panOpts.chnPan, 0x00, sizeof(devOpts.panOpts.chnPan));
	return 0x00;
}